

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,write_ini_item>
          (xr_ini_writer *this,
          vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *container)

{
  bool bVar1;
  reference item;
  __normal_iterator<const_xray_re::sector_item_*,_std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  uint32_t id;
  vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *container_local;
  xr_ini_writer *this_local;
  
  it._M_current._4_4_ = 0;
  end = std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::begin(container);
  local_38._M_current =
       (sector_item *)
       std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_xray_re::sector_item_*,_std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>_>
           ::operator*(&end);
    write_ini_item::operator()
              ((write_ini_item *)((long)&this_local + 7),item,this,it._M_current._4_4_);
    __gnu_cxx::
    __normal_iterator<const_xray_re::sector_item_*,_std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}